

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

quad_value_bit_vector *
bsim::lshr(quad_value_bit_vector *__return_storage_ptr__,quad_value_bit_vector *a,
          quad_value_bit_vector *shift_amount)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pqVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  unsigned_short uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  string *other;
  bool bVar14;
  quad_value_bit_vector res;
  string local_50;
  
  iVar2 = a->N;
  uVar13 = (ulong)iVar2;
  bVar14 = (long)uVar13 < 1;
  if ((long)uVar13 < 1) {
LAB_0013e888:
    if (bVar14) {
      uVar13 = (ulong)shift_amount->N;
      bVar14 = (long)uVar13 < 1;
      if (0 < (long)uVar13) {
        pqVar3 = (shift_amount->bits).
                 super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (1 < pqVar3->value) goto LAB_0013e8f1;
        uVar5 = 1;
        do {
          uVar10 = uVar5;
          if (uVar13 == uVar10) break;
          uVar5 = uVar10 + 1;
        } while (pqVar3[uVar10].value < 2);
        bVar14 = uVar13 <= uVar10;
      }
      if (bVar14) {
        quad_value_bit_vector::quad_value_bit_vector((quad_value_bit_vector *)&local_50,iVar2);
        iVar2 = shift_amount->N;
        if (0x40 < iVar2) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x3b0,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
        }
        if (iVar2 < 0x21) {
          if (iVar2 < 0x11) {
            if (iVar2 < 9) {
              bVar6 = quad_value_bit_vector::to_type<unsigned_char>(shift_amount);
              uVar13 = (ulong)bVar6;
            }
            else {
              uVar7 = quad_value_bit_vector::to_type<unsigned_short>(shift_amount);
              uVar13 = (ulong)uVar7;
            }
          }
          else {
            uVar8 = quad_value_bit_vector::to_type<unsigned_int>(shift_amount);
            uVar13 = (ulong)uVar8;
          }
        }
        else {
          uVar13 = quad_value_bit_vector::to_type<unsigned_long>(shift_amount);
        }
        if (0x40 < uVar13) {
          __assert_fail("shift_int < 65",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x3c2,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
        }
        other = (string *)a;
        if (uVar13 != 0) {
          iVar2 = a->N;
          lVar9 = (long)iVar2;
          uVar8 = (uint)uVar13;
          if ((int)uVar8 < iVar2) {
            lVar11 = (ulong)(~uVar8 + iVar2) << 0x20;
            do {
              lVar4 = lVar9 + -1;
              lVar9 = lVar9 + -1;
              local_50._M_dataplus._M_p[lVar11 >> 0x20] =
                   (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar4].value;
              lVar11 = lVar11 + -0x100000000;
            } while ((long)uVar13 < lVar9);
          }
          lVar9 = (long)a->N;
          do {
            local_50._M_dataplus._M_p[lVar9 + -1] = '\0';
            lVar9 = lVar9 + -1;
            other = &local_50;
          } while ((long)a->N - (long)(int)uVar8 < lVar9);
        }
        quad_value_bit_vector::quad_value_bit_vector
                  (__return_storage_ptr__,(quad_value_bit_vector *)other);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          return __return_storage_ptr__;
        }
        goto LAB_0013e944;
      }
    }
  }
  else {
    pqVar3 = (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pqVar3->value < 2) {
      uVar5 = 1;
      do {
        uVar10 = uVar5;
        if (uVar13 == uVar10) break;
        uVar5 = uVar10 + 1;
      } while (pqVar3[uVar10].value < 2);
      bVar14 = uVar13 <= uVar10;
      goto LAB_0013e888;
    }
  }
LAB_0013e8f1:
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (0 < iVar2) {
    iVar12 = iVar2;
    do {
      std::__cxx11::string::append((char *)&local_50);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  quad_value_bit_vector::quad_value_bit_vector(__return_storage_ptr__,iVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
LAB_0013e944:
  operator_delete(local_50._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

static inline quad_value_bit_vector
  lshr(const quad_value_bit_vector& a,
       const quad_value_bit_vector& shift_amount) {

    if (!a.is_binary() || !shift_amount.is_binary()) {
      return unknown_bv(a.bitLength());
    }
    
    quad_value_bit_vector res(a.bitLength());

    bv_uint64 shift_int = get_shift_int(shift_amount);

    if (shift_int == 0) {
      return a;
    }

    //unsigned char sign_bit = a.get(a.bitLength() - 1);
    for (int i = a.bitLength() - 1; i >= (int) shift_int; i--) {
      res.set(i - shift_int, a.get(i));
    }

    for (int i = a.bitLength() - 1; i >= (((int) a.bitLength()) - ((int) shift_int)); i--) {
      res.set(i, 0);
    }

    return res;
  }